

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

void cpsm::
     str_cat_impl<char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
               (stringstream *ss,char **x,unsigned_long args,char *args_1,unsigned_long args_2,
               char *args_3,unsigned_long args_4,char *args_5,unsigned_long args_6,char *args_7,
               unsigned_long args_8,char *args_9,unsigned_long args_10)

{
  unsigned_long *in_RCX;
  stringstream *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  char *in_R8;
  unsigned_long in_R9;
  char *unaff_R14;
  unsigned_long unaff_R15;
  char *unaff_retaddr;
  unsigned_long in_stack_00000008;
  char *in_stack_00000010;
  unsigned_long in_stack_00000018;
  
  std::operator<<((ostream *)(in_RDI + 0x10),(char *)*in_RSI);
  str_cat_impl<unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
            (in_RDX,in_RCX,in_R8,in_R9,(char *)args_2,(unsigned_long)args_3,unaff_R14,unaff_R15,
             unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}